

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall JSON::Parser::readNumberToken(Token *__return_storage_ptr__,Parser *this)

{
  string *psVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined8 extraout_RAX;
  int iVar10;
  bool bVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  string value;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  iVar6 = this->pos;
  if ((this->input)._M_dataplus._M_p[iVar6] == '-') {
    this->pos = iVar6 + 1;
  }
  iVar9 = this->pos;
  if (iVar9 < this->length) {
    psVar1 = &this->input;
    bVar7 = true;
    iVar12 = 0;
    bVar11 = false;
    bVar14 = false;
    bVar13 = false;
    do {
      bVar4 = (psVar1->_M_dataplus)._M_p[iVar9];
      bVar8 = isNumberChar((uint)bVar4);
      if (bVar8) {
        bVar13 = bVar14;
        if (iVar12 == 0) {
          bVar13 = true;
          bVar11 = true;
        }
        iVar9 = this->pos + 1;
        bVar7 = false;
        bVar14 = bVar13;
LAB_001064a5:
        this->pos = iVar9;
      }
      else {
        if (bVar7) break;
        if (((bVar4 & 0xffffffdf) != 0x45) || (!bVar13)) {
          if ((bVar4 == 0x2e) && (bVar11)) {
            iVar9 = this->pos + 1;
LAB_001064a2:
            bVar7 = true;
            bVar11 = false;
            goto LAB_001064a5;
          }
          break;
        }
        iVar9 = this->pos;
        lVar2 = (long)iVar9 + 1;
        iVar10 = (int)lVar2;
        this->pos = iVar10;
        bVar7 = true;
        if ((iVar10 < this->length) &&
           ((cVar5 = (psVar1->_M_dataplus)._M_p[lVar2], cVar5 == '-' || (cVar5 == '+')))) {
          iVar9 = iVar9 + 2;
          bVar13 = false;
          bVar14 = false;
          goto LAB_001064a2;
        }
        bVar13 = false;
        bVar14 = false;
        bVar11 = false;
      }
      iVar9 = this->pos;
      iVar12 = iVar12 + -1;
    } while (iVar9 < this->length);
    if (!bVar7) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_50,local_48 + (long)local_50);
      iVar9 = this->pos;
      __return_storage_ptr__->type = NUMBER;
      paVar3 = &(__return_storage_ptr__->value).field_2;
      (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar3;
      if (local_70 == &local_60) {
        paVar3->_M_allocated_capacity = CONCAT71(uStack_5f,local_60);
        *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_58;
      }
      else {
        (__return_storage_ptr__->value)._M_dataplus._M_p = local_70;
        (__return_storage_ptr__->value).field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60)
        ;
      }
      (__return_storage_ptr__->value)._M_string_length = local_68;
      local_68 = 0;
      local_60 = '\0';
      __return_storage_ptr__->start = iVar6;
      __return_storage_ptr__->end = iVar9;
      if (local_50 != local_40) {
        local_70 = &local_60;
        operator_delete(local_50,local_40[0] + 1);
      }
      return __return_storage_ptr__;
    }
  }
  unexpected(this,TYPE_NUMBER,this->pos);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token Parser::readNumberToken() {
        int chunkStart = pos;
        int count = 0;
        bool allowDot = false;
        bool allowE = false;
        bool expectNumber = true;
        int code = getCodeAt(pos);

        if (code == 45) { // '-'
            pos++;
        }

        while (isValidPos()) {
            code = getCodeAt(pos);
            count++;

            if (isNumberChar(code)) {
                if (count == 1) {
                    allowDot = true;
                    allowE = true;
                }
                expectNumber = false;
                pos++;
            } else if (expectNumber) {
                break;
            } else if (allowE && (code == 69 || code == 101)) { // 'E' or 'e'
                allowE = false;
                allowDot = false;
                expectNumber = true;
                pos++;
                if (isValidPos() && (getCodeAt(pos) == 43 || getCodeAt(pos) == 45)) { // '+' or '-'
                    pos++;
                }
            } else if (allowDot && code == 46) { // '.'
                allowDot = false;
                expectNumber = true;
                pos++;
            } else {
                break;
            }
        }

        // check
        if (expectNumber) {
            unexpected(TYPE_NUMBER, pos);
        }

        string value = input.substr(chunkStart, pos - chunkStart);
        return Token(NUMBER, value, chunkStart, pos);
    }